

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O3

void __thiscall QTextMarkdownImporter::import(QTextMarkdownImporter *this,QString *markdown)

{
  char16_t **ppcVar1;
  char16_t *pcVar2;
  int *piVar3;
  QDebug this_00;
  totally_ordered_wrapper<QFontPrivate_*> tVar4;
  char cVar5;
  int iVar6;
  QTextDocument *this_01;
  long lVar7;
  long lVar8;
  long lVar9;
  MD_CHAR *text;
  char *pcVar10;
  storage_type_conflict *psVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QByteArrayView QVar17;
  QStringView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QString local_e8;
  char *local_d0;
  QDebug local_c8;
  undefined1 local_c0 [8];
  totally_ordered_wrapper<QFontPrivate_*> local_b8;
  QFont local_b0;
  MD_PARSER local_a0;
  QArrayData *local_60 [3];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.abi_version = 0;
  local_a0.flags =
       (this->m_features).super_QFlagsStorageHelper<QTextMarkdownImporter::Feature,_4>.
       super_QFlagsStorage<QTextMarkdownImporter::Feature>.i;
  local_a0.enter_block = CbEnterBlock;
  local_a0.leave_block = CbLeaveBlock;
  local_a0.enter_span = CbEnterSpan;
  local_a0.leave_span = CbLeaveSpan;
  local_a0.text = CbText;
  local_a0.debug_log = CbDebugLog;
  local_a0.syntax = (_func_void *)0x0;
  this_01 = QTextCursor::document(&this->m_cursor);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultFont((QTextDocument *)local_48);
  iVar6 = QFont::pointSize((QFont *)local_48);
  this->m_paragraphMargin = (iVar6 * 2) / 3;
  (**(code **)(*(long *)this_01 + 0x60))(this_01);
  iVar6 = QFont::pointSize((QFont *)local_48);
  if (iVar6 == -1) {
    iVar6 = QFont::pixelSize((QFont *)local_48);
    QFont::setPixelSize(&this->m_monoFont,iVar6);
  }
  else {
    iVar6 = QFont::pointSize((QFont *)local_48);
    QFont::setPointSize(&this->m_monoFont,iVar6);
  }
  lcMD();
  if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_e8.d.d._0_4_ = 2;
    local_e8.d.d._4_4_ = 0;
    local_e8.d.ptr._0_4_ = 0;
    local_e8.d.ptr._4_4_ = 0;
    local_e8.d.size._0_4_ = 0;
    local_e8.d.size._4_4_ = 0;
    local_d0 = lcMD::category.name;
    QMessageLogger::debug();
    this_00.stream = local_c8.stream;
    QVar12.m_data = &DAT_0000000c;
    QVar12.m_size = (qsizetype)local_60;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(&(this_00.stream)->ts,(QString *)local_60);
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,0x10);
      }
    }
    if ((local_c8.stream)->space == true) {
      QTextStream::operator<<(&(local_c8.stream)->ts,' ');
    }
    (local_c8.stream)->ref = (local_c8.stream)->ref + 1;
    ::operator<<((Stream *)&local_b8,(QFont *)local_c0);
    tVar4.ptr = local_b8.ptr;
    QVar13.m_data = (storage_type *)0x9;
    QVar13.m_size = (qsizetype)local_60;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)tVar4.ptr,(QString *)local_60);
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,0x10);
      }
    }
    if ((char)((local_b8.ptr)->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)local_b8.ptr,' ');
    }
    local_b0.d.d.ptr =
         (totally_ordered_wrapper<QFontPrivate_*>)
         (totally_ordered_wrapper<QFontPrivate_*>)local_b8.ptr;
    ppcVar1 = &((local_b8.ptr)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((QDebug)&local_b0.resolve_mask,&local_b0);
    QDebug::~QDebug((QDebug *)&local_b0.resolve_mask);
    QDebug::~QDebug((QDebug *)&local_b0);
    QDebug::~QDebug((QDebug *)&local_b8);
    QDebug::~QDebug((QDebug *)local_c0);
    QDebug::~QDebug(&local_c8);
  }
  pcVar2 = (markdown->d).ptr;
  psVar11 = (storage_type_conflict *)(markdown->d).size;
  if (((this->m_features).super_QFlagsStorageHelper<QTextMarkdownImporter::Feature,_4>.
       super_QFlagsStorage<QTextMarkdownImporter::Feature>.i & 0x100000) != 0) {
    pcVar10 = "---\n";
    lVar9 = 4;
    QVar14.m_data = pcVar2;
    QVar14.m_size = (qsizetype)psVar11;
    QVar19.m_data = "---\n";
    QVar19.m_size = 4;
    cVar5 = QtPrivate::startsWith(QVar14,QVar19,CaseSensitive);
    if (cVar5 == '\0') {
      pcVar10 = "---\r\n";
      lVar9 = 5;
      QVar15.m_data = pcVar2;
      QVar15.m_size = (qsizetype)psVar11;
      QVar20.m_data = "---\r\n";
      QVar20.m_size = 5;
      cVar5 = QtPrivate::startsWith(QVar15,QVar20,CaseSensitive);
      if (cVar5 == '\0') goto LAB_005c1782;
    }
    QVar16.m_data = pcVar2;
    QVar16.m_size = (qsizetype)psVar11;
    QVar21.m_data = pcVar10;
    QVar21.m_size = lVar9;
    lVar7 = QtPrivate::findString(QVar16,lVar9,QVar21,CaseSensitive);
    if (((-1 < lVar7) && (pcVar2[lVar7 + -1] == L'\n')) && (lVar8 = lVar7 - lVar9, lVar8 != 0)) {
      QString::QString(&local_e8,(QChar *)(pcVar2 + lVar9),lVar8);
      QTextDocument::setMetaInformation(this_01,FrontMatter,&local_e8);
      piVar3 = (int *)CONCAT44(local_e8.d.d._4_4_,local_e8.d.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_e8.d.d._4_4_,local_e8.d.d._0_4_),2,0x10);
        }
      }
      psVar11 = (storage_type_conflict *)((long)psVar11 - (lVar7 + lVar9));
      lcMD();
      if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_e8.d.d._0_4_ = 2;
        local_e8.d.d._4_4_ = 0;
        local_e8.d.ptr._0_4_ = 0;
        local_e8.d.ptr._4_4_ = 0;
        local_e8.d.size._0_4_ = 0;
        local_e8.d.size._4_4_ = 0;
        local_d0 = lcMD::category.name;
        QMessageLogger::debug();
        tVar4.ptr = local_b8.ptr;
        QVar17.m_data = (storage_type *)0x1b;
        QVar17.m_size = (qsizetype)local_60;
        QString::fromUtf8(QVar17);
        QTextStream::operator<<((QTextStream *)tVar4.ptr,(QString *)local_60);
        if (local_60[0] != (QArrayData *)0x0) {
          LOCK();
          (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_60[0],2,0x10);
          }
        }
        if ((char)((local_b8.ptr)->request).styleName.d.size == '\x01') {
          QTextStream::operator<<((QTextStream *)local_b8.ptr,' ');
        }
        QTextStream::operator<<((QTextStream *)local_b8.ptr,lVar8);
        if ((char)((local_b8.ptr)->request).styleName.d.size == '\x01') {
          QTextStream::operator<<((QTextStream *)local_b8.ptr,' ');
        }
        QDebug::~QDebug((QDebug *)&local_b8);
      }
    }
  }
LAB_005c1782:
  local_e8.d.size._0_4_ = 0xaaaaaaaa;
  local_e8.d.size._4_4_ = 0xaaaaaaaa;
  local_e8.d.d._0_4_ = 0xaaaaaaaa;
  local_e8.d.d._4_4_ = 0xaaaaaaaa;
  local_e8.d.ptr._0_4_ = 0xaaaaaaaa;
  local_e8.d.ptr._4_4_ = 0xaaaaaaaa;
  QVar18.m_data = psVar11;
  QVar18.m_size = (qsizetype)&local_e8;
  QtPrivate::convertToUtf8(QVar18);
  QTextCursor::beginEditBlock(&this->m_cursor);
  text = (MD_CHAR *)CONCAT44(local_e8.d.ptr._4_4_,local_e8.d.ptr._0_4_);
  if (text == (MD_CHAR *)0x0) {
    text = (MD_CHAR *)&QByteArray::_empty;
  }
  md_parse(text,(MD_SIZE)local_e8.d.size,&local_a0,this);
  QTextCursor::endEditBlock(&this->m_cursor);
  piVar3 = (int *)CONCAT44(local_e8.d.d._4_4_,local_e8.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_e8.d.d._4_4_,local_e8.d.d._0_4_),1,0x10);
    }
  }
  QFont::~QFont((QFont *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextMarkdownImporter::import(const QString &markdown)
{
    MD_PARSER callbacks = {
        0, // abi_version
        unsigned(m_features),
        &CbEnterBlock,
        &CbLeaveBlock,
        &CbEnterSpan,
        &CbLeaveSpan,
        &CbText,
        &CbDebugLog,
        nullptr // syntax
    };
    QTextDocument *doc = m_cursor.document();
    const auto defaultFont = doc->defaultFont();
    m_paragraphMargin = defaultFont.pointSize() * 2 / 3;
    doc->clear();
    if (defaultFont.pointSize() != -1)
        m_monoFont.setPointSize(defaultFont.pointSize());
    else
        m_monoFont.setPixelSize(defaultFont.pixelSize());
    qCDebug(lcMD) << "default font" << defaultFont << "mono font" << m_monoFont;
    QStringView md = markdown;

    if (m_features.testFlag(QTextMarkdownImporter::FeatureFrontMatter)) {
        if (const auto split = splitFrontMatter(md)) {
            doc->setMetaInformation(QTextDocument::FrontMatter, split.frontMatter.toString());
            qCDebug(lcMD) << "extracted FrontMatter: size" << split.frontMatter.size();
            md = split.rest;
        }
    }

    const auto mdUtf8 = md.toUtf8();
    m_cursor.beginEditBlock();
    md_parse(mdUtf8.constData(), MD_SIZE(mdUtf8.size()), &callbacks, this);
    m_cursor.endEditBlock();
}